

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

Net * __thiscall notch::core::Net::append(Net *this,ABackpropLayer *layer)

{
  int iVar1;
  undefined4 extraout_var;
  shared_ptr<notch::core::ABackpropLayer> local_28;
  ABackpropLayer *local_18;
  ABackpropLayer *layer_local;
  Net *this_local;
  
  local_18 = layer;
  layer_local = (ABackpropLayer *)this;
  (*layer->_vptr_ABackpropLayer[0xb])();
  iVar1 = (**this->_vptr_Net)(this,&local_28);
  std::shared_ptr<notch::core::ABackpropLayer>::~shared_ptr(&local_28);
  return (Net *)CONCAT44(extraout_var,iVar1);
}

Assistant:

virtual Net &append(const ABackpropLayer &layer) {
        return append(layer.clone());
    }